

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_compute_pipelines
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *pipelines)

{
  bool bVar1;
  ConstMemberIterator CVar2;
  Pointer member;
  ConstMemberIterator CVar3;
  
  CVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberBegin(pipelines);
  do {
    member = CVar2.ptr_;
    CVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(pipelines);
    if (member == CVar3.ptr_) {
      (*iface->_vptr_StateCreatorInterface[0x11])(iface);
      break;
    }
    bVar1 = parse_compute_pipeline(this,iface,resolver,pipelines,&member->name);
    CVar2.ptr_ = member + 1;
  } while (bVar1);
  return member == CVar3.ptr_;
}

Assistant:

bool StateReplayer::Impl::parse_compute_pipelines(StateCreatorInterface &iface, DatabaseInterface *resolver, const Value &pipelines)
{
	for (auto itr = pipelines.MemberBegin(); itr != pipelines.MemberEnd(); ++itr)
		if (!parse_compute_pipeline(iface, resolver, pipelines, itr->name))
			return false;
	iface.notify_replayed_resources_for_type();
	return true;
}